

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_update_servers.c
# Opt level: O3

ares_status_t
ares_sconfig_append_fromstr
          (ares_channel_t *channel,ares_llist_t **sconfig,char *str,ares_bool_t ignore_invalid)

{
  ares_buf_t *buf;
  unsigned_short uVar1;
  ares_status_t aVar2;
  ares_bool_t aVar3;
  int iVar4;
  size_t sVar5;
  ares_buf_t *buf_00;
  undefined8 *puVar6;
  char *pcVar7;
  void *pvVar8;
  size_t sVar9;
  long lVar10;
  uchar *puVar11;
  size_t idx;
  ares_status_t aVar12;
  byte bVar13;
  ares_array_t *list;
  ares_sconfig_t s;
  ares_uri_t *uri;
  size_t addrlen;
  char hoststr [256];
  ares_array_t *local_1c0;
  undefined1 local_1b8 [20];
  unsigned_short uStack_1a4;
  unsigned_short uStack_1a2;
  char acStack_1a0 [24];
  ares_uri_t *local_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined6 uStack_170;
  undefined2 local_16a;
  undefined6 uStack_168;
  undefined8 uStack_162;
  ares_channel_t *local_150;
  ares_llist_t **local_148;
  size_t local_140;
  uchar local_138 [64];
  undefined4 local_f8;
  undefined2 local_f4;
  
  bVar13 = 0;
  local_1c0 = (ares_array_t *)0x0;
  sVar5 = ares_strlen(str);
  buf_00 = ares_buf_create_const((uchar *)str,sVar5);
  if (buf_00 == (ares_buf_t *)0x0) {
    aVar2 = ARES_ENOMEM;
  }
  else {
    aVar2 = ares_buf_split(buf_00,(uchar *)" ,",2,ARES_BUF_SPLIT_NONE,0,&local_1c0);
    if (aVar2 == ARES_SUCCESS) {
      sVar5 = ares_array_len(local_1c0);
      aVar2 = ARES_SUCCESS;
      if (sVar5 != 0) {
        idx = 0;
        local_150 = channel;
        local_148 = sconfig;
        do {
          puVar6 = (undefined8 *)ares_array_at(local_1c0,idx);
          buf = (ares_buf_t *)*puVar6;
          local_188 = (ares_uri_t *)0x0;
          aVar2 = ares_uri_parse_buf(&local_188,buf);
          if (aVar2 == ARES_SUCCESS) {
            pcVar7 = ares_uri_get_scheme(local_188);
            aVar3 = ares_streq("dns",pcVar7);
            if (aVar3 == ARES_FALSE) {
LAB_0011871e:
              ares_uri_destroy(local_188);
              goto LAB_00118728;
            }
            pcVar7 = ares_uri_get_host(local_188);
            ares_strcpy((char *)local_138,pcVar7,0x100);
            pcVar7 = strchr((char *)local_138,0x25);
            if (pcVar7 != (char *)0x0) {
              *pcVar7 = '\0';
              ares_strcpy(acStack_1a0,pcVar7 + 1,0x10);
            }
            local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
            pvVar8 = ares_dns_pton((char *)local_138,(ares_addr *)local_1b8,&local_140);
            if (pvVar8 == (void *)0x0) goto LAB_0011871e;
            uVar1 = ares_uri_get_port(local_188);
            stack0xfffffffffffffe58 = CONCAT24(uVar1,local_1b8._16_4_);
            stack0xfffffffffffffe58 = CONCAT26(uVar1,stack0xfffffffffffffe58);
            pcVar7 = ares_uri_get_query_key(local_188,"tcpport");
            if (pcVar7 != (char *)0x0) {
              iVar4 = atoi(pcVar7);
              stack0xfffffffffffffe58 = CONCAT24((short)iVar4,local_1b8._16_4_);
            }
            ares_uri_destroy(local_188);
LAB_001186ea:
            aVar2 = ares_sconfig_append(local_150,local_148,(ares_addr *)local_1b8,uStack_1a2,
                                        uStack_1a4,acStack_1a0);
            if (aVar2 != ARES_SUCCESS) goto LAB_001189fe;
          }
          else {
LAB_00118728:
            uStack_168 = 0;
            uStack_162 = 0;
            uStack_178 = 0;
            uStack_170 = 0;
            local_16a = 0;
            local_188 = (ares_uri_t *)0x0;
            uStack_180 = 0;
            local_1b8._0_8_ = 0;
            local_1b8._8_8_ = 0;
            stack0xfffffffffffffe58 = 0;
            acStack_1a0[0] = '\0';
            acStack_1a0[1] = '\0';
            acStack_1a0[2] = '\0';
            acStack_1a0[3] = '\0';
            acStack_1a0[4] = '\0';
            acStack_1a0[5] = '\0';
            acStack_1a0[6] = '\0';
            acStack_1a0[7] = '\0';
            acStack_1a0[8] = '\0';
            acStack_1a0[9] = '\0';
            acStack_1a0[10] = '\0';
            acStack_1a0[0xb] = '\0';
            acStack_1a0[0xc] = '\0';
            acStack_1a0[0xd] = '\0';
            acStack_1a0[0xe] = '\0';
            acStack_1a0[0xf] = '\0';
            acStack_1a0[0x10] = '\0';
            acStack_1a0[0x11] = '\0';
            acStack_1a0[0x12] = '\0';
            acStack_1a0[0x13] = '\0';
            ares_buf_consume_whitespace(buf,ARES_TRUE);
            aVar3 = ares_buf_begins_with(buf,(uchar *)"[",1);
            if (aVar3 == ARES_FALSE) {
              ares_buf_tag(buf);
              sVar9 = ares_buf_consume_until_charset(buf,".",1,ARES_TRUE);
              ares_buf_tag_rollback(buf);
              ares_buf_tag(buf);
              if (sVar9 - 1 < 3) {
                sVar9 = 0xb;
                pcVar7 = "0123456789.";
              }
              else {
                builtin_memcpy(local_138 + 0x10,"456789.:",9);
                builtin_memcpy(local_138,"ABCDEFabcdef0123",0x10);
                sVar9 = 0x18;
                pcVar7 = (char *)local_138;
              }
              sVar9 = ares_buf_consume_charset(buf,(uchar *)pcVar7,sVar9);
              if (sVar9 != 0) {
                aVar2 = ares_buf_tag_fetch_string(buf,(char *)&local_188,0x2e);
                if (aVar2 == ARES_SUCCESS) goto LAB_00118892;
                goto LAB_00118879;
              }
LAB_00118873:
              aVar2 = ARES_EBADSTR;
            }
            else {
              ares_buf_consume(buf,1);
              ares_buf_tag(buf);
              sVar9 = ares_buf_consume_until_charset(buf,(uchar *)"]",1,ARES_TRUE);
              if (sVar9 == 0xffffffffffffffff) goto LAB_00118873;
              aVar2 = ares_buf_tag_fetch_string(buf,(char *)&local_188,0x2e);
              if (aVar2 == ARES_SUCCESS) {
                ares_buf_consume(buf,1);
LAB_00118892:
                local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
                pvVar8 = ares_dns_pton((char *)&local_188,(ares_addr *)local_1b8,&local_140);
                aVar12 = ARES_EBADSTR;
                aVar2 = aVar12;
                if (pvVar8 != (void *)0x0) {
                  aVar3 = ares_buf_begins_with(buf,(uchar *)":",1);
                  if (aVar3 == ARES_FALSE) {
LAB_0011893a:
                    aVar3 = ares_buf_begins_with(buf,(uchar *)"%",1);
                    if (aVar3 != ARES_FALSE) {
                      pcVar7 = 
                      "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789.-_\\:{}";
                      puVar11 = local_138;
                      for (lVar10 = 8; lVar10 != 0; lVar10 = lVar10 + -1) {
                        *(undefined8 *)puVar11 = *(undefined8 *)pcVar7;
                        pcVar7 = pcVar7 + ((ulong)bVar13 * -2 + 1) * 8;
                        puVar11 = puVar11 + ((ulong)bVar13 * -2 + 1) * 8;
                      }
                      local_f4 = 0x7d;
                      local_f8 = 0x7b3a5c5f;
                      ares_buf_consume(buf,1);
                      ares_buf_tag(buf);
                      sVar9 = ares_buf_consume_charset(buf,local_138,0x45);
                      aVar2 = aVar12;
                      if ((sVar9 == 0) ||
                         (aVar2 = ares_buf_tag_fetch_string(buf,acStack_1a0,0x10),
                         aVar2 != ARES_SUCCESS)) goto LAB_00118879;
                    }
                    ares_buf_consume_whitespace(buf,ARES_TRUE);
                    sVar9 = ares_buf_len(buf);
                    aVar2 = aVar12;
                    if (sVar9 == 0) goto LAB_001186ea;
                  }
                  else {
                    ares_buf_consume(buf,1);
                    ares_buf_tag(buf);
                    sVar9 = ares_buf_consume_charset(buf,(uchar *)"0123456789",10);
                    if (sVar9 == 0) {
                      aVar2 = ARES_EBADSTR;
                    }
                    else {
                      aVar2 = ares_buf_tag_fetch_string(buf,(char *)local_138,6);
                      if (aVar2 == ARES_SUCCESS) {
                        iVar4 = atoi((char *)local_138);
                        stack0xfffffffffffffe58 = CONCAT24((short)iVar4,local_1b8._16_4_);
                        stack0xfffffffffffffe58 = CONCAT26((short)iVar4,stack0xfffffffffffffe58);
                        goto LAB_0011893a;
                      }
                    }
                  }
                }
              }
            }
LAB_00118879:
            if (ignore_invalid == ARES_FALSE) goto LAB_001189fe;
          }
          idx = idx + 1;
        } while (sVar5 != idx);
        aVar2 = ARES_SUCCESS;
      }
    }
  }
LAB_001189fe:
  ares_array_destroy(local_1c0);
  ares_buf_destroy(buf_00);
  return aVar2;
}

Assistant:

ares_status_t ares_sconfig_append_fromstr(const ares_channel_t *channel,
                                          ares_llist_t        **sconfig,
                                          const char           *str,
                                          ares_bool_t           ignore_invalid)
{
  ares_status_t status = ARES_SUCCESS;
  ares_buf_t   *buf    = NULL;
  ares_array_t *list   = NULL;
  size_t        num;
  size_t        i;

  /* On Windows, there may be more than one nameserver specified in the same
   * registry key, so we parse input as a space or comma separated list.
   */
  buf = ares_buf_create_const((const unsigned char *)str, ares_strlen(str));
  if (buf == NULL) {
    status = ARES_ENOMEM;
    goto done;
  }

  status = ares_buf_split(buf, (const unsigned char *)" ,", 2,
                          ARES_BUF_SPLIT_NONE, 0, &list);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  num = ares_array_len(list);
  for (i = 0; i < num; i++) {
    ares_buf_t   **bufptr = ares_array_at(list, i);
    ares_buf_t    *entry  = *bufptr;
    ares_sconfig_t s;

    status = parse_nameserver_uri(entry, &s);
    if (status != ARES_SUCCESS) {
      status = parse_nameserver(entry, &s);
    }

    if (status != ARES_SUCCESS) {
      if (ignore_invalid) {
        continue;
      } else {
        goto done;
      }
    }

    status = ares_sconfig_append(channel, sconfig, &s.addr, s.udp_port,
                                 s.tcp_port, s.ll_iface);
    if (status != ARES_SUCCESS) {
      goto done; /* LCOV_EXCL_LINE: OutOfMemory */
    }
  }

  status = ARES_SUCCESS;

done:
  ares_array_destroy(list);
  ares_buf_destroy(buf);
  return status;
}